

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureFormat *format,int width,int height,int depth,
          int rowPitch,int slicePitch,void *data)

{
  int x_;
  int rowPitch_local;
  int depth_local;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  ConstPixelBufferAccess *this_local;
  
  this->m_format = *format;
  Vector<int,_3>::Vector(&this->m_size,width,height,depth);
  x_ = TextureFormat::getPixelSize(format);
  Vector<int,_3>::Vector(&this->m_pitch,x_,rowPitch,slicePitch);
  this->m_data = data;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureFormat& format, int width, int height, int depth, int rowPitch, int slicePitch, const void* data)
	: m_format		(format)
	, m_size		(width, height, depth)
	, m_pitch		(format.getPixelSize(), rowPitch, slicePitch)
	, m_data		((void*)data)
{
	DE_ASSERT(isValid(format));
}